

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3OpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  void *__s;
  undefined8 *in_RSI;
  sqlite3_vtab_cursor *pCsr;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  __s = sqlite3_malloc(in_stack_ffffffffffffffdc);
  *in_RSI = __s;
  if (__s == (void *)0x0) {
    local_4 = 7;
  }
  else {
    memset(__s,0,0x90);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int fts3OpenMethod(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCsr){
  sqlite3_vtab_cursor *pCsr;               /* Allocated cursor */

  UNUSED_PARAMETER(pVTab);

  /* Allocate a buffer large enough for an Fts3Cursor structure. If the
  ** allocation succeeds, zero it and return SQLITE_OK. Otherwise, 
  ** if the allocation fails, return SQLITE_NOMEM.
  */
  *ppCsr = pCsr = (sqlite3_vtab_cursor *)sqlite3_malloc(sizeof(Fts3Cursor));
  if( !pCsr ){
    return SQLITE_NOMEM;
  }
  memset(pCsr, 0, sizeof(Fts3Cursor));
  return SQLITE_OK;
}